

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

QModelIndex * __thiscall QTableView::indexAt(QTableView *this,QPoint *pos)

{
  bool bVar1;
  QTableViewPrivate *pQVar2;
  QTableViewPrivate *in_RDI;
  long in_FS_OFFSET;
  int c;
  int r;
  QTableViewPrivate *d;
  Span span;
  int in_stack_ffffffffffffff7c;
  QAbstractItemViewPrivate *in_stack_ffffffffffffff80;
  QAbstractItemModel *pQVar3;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  QTableViewPrivate *this_00;
  int local_58;
  int local_54;
  QPersistentModelIndex local_38 [3];
  undefined1 *local_1c;
  undefined1 *local_14;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar2 = d_func((QTableView *)0x8b872f);
  QAbstractItemViewPrivate::executePostedLayout(in_stack_ffffffffffffff80);
  QPoint::y((QPoint *)0x8b8748);
  local_54 = rowAt((QTableView *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  QPoint::x((QPoint *)0x8b8762);
  local_58 = columnAt((QTableView *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  if ((local_54 < 0) || (local_58 < 0)) {
    QModelIndex::QModelIndex((QModelIndex *)0x8b884d);
  }
  else {
    bVar1 = QTableViewPrivate::hasSpans((QTableViewPrivate *)0x8b8792);
    if (bVar1) {
      local_1c = &DAT_aaaaaaaaaaaaaaaa;
      local_14 = &DAT_aaaaaaaaaaaaaaaa;
      local_c._0_1_ = true;
      local_c._1_3_ = 0xaaaaaa;
      QTableViewPrivate::span(this_00,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
      local_54 = QSpanCollection::Span::top((Span *)&local_1c);
      local_58 = QSpanCollection::Span::left((Span *)&local_1c);
    }
    pQVar3 = (pQVar2->super_QAbstractItemViewPrivate).model;
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_38);
    (**(code **)(*(long *)pQVar3 + 0x60))(this_00,pQVar3,local_54,local_58,local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QModelIndex *)in_RDI;
}

Assistant:

QModelIndex QTableView::indexAt(const QPoint &pos) const
{
    Q_D(const QTableView);
    d->executePostedLayout();
    int r = rowAt(pos.y());
    int c = columnAt(pos.x());
    if (r >= 0 && c >= 0) {
        if (d->hasSpans()) {
            QSpanCollection::Span span = d->span(r, c);
            r = span.top();
            c = span.left();
        }
        return d->model->index(r, c, d->root);
    }
    return QModelIndex();
}